

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixShmBarrier(sqlite3_file *fd)

{
  unixEnterMutex();
  unixLeaveMutex();
  return;
}

Assistant:

static void unixShmBarrier(
  sqlite3_file *fd                /* Database file holding the shared memory */
){
  UNUSED_PARAMETER(fd);
  unixEnterMutex();
  unixLeaveMutex();
}